

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_search.c
# Opt level: O1

void ares_dnsrec_convert_cb
               (void *arg,ares_status_t status,size_t timeouts,ares_dns_record_t *dnsrec)

{
  ares_status_t aVar1;
  uchar *abuf;
  size_t alen;
  uchar *local_28;
  size_t local_20;
  
  local_28 = (uchar *)0x0;
  local_20 = 0;
  if (dnsrec != (ares_dns_record_t *)0x0) {
    aVar1 = ares_dns_write(dnsrec,&local_28,&local_20);
    if (aVar1 != ARES_SUCCESS) {
      status = aVar1;
    }
  }
  (**arg)(*(undefined8 *)((long)arg + 8),status,timeouts & 0xffffffff,local_28,local_20 & 0xffffffff
         );
  ares_free(local_28);
  ares_free(arg);
  return;
}

Assistant:

void ares_dnsrec_convert_cb(void *arg, ares_status_t status, size_t timeouts,
                            const ares_dns_record_t *dnsrec)
{
  dnsrec_convert_arg_t *carg = arg;
  unsigned char        *abuf = NULL;
  size_t                alen = 0;

  if (dnsrec != NULL) {
    ares_status_t mystatus = ares_dns_write(dnsrec, &abuf, &alen);
    if (mystatus != ARES_SUCCESS) {
      status = mystatus;
    }
  }

  carg->callback(carg->arg, (int)status, (int)timeouts, abuf, (int)alen);

  ares_free(abuf);
  ares_free(carg);
}